

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

void __thiscall
TPZAutoPointer<TPZFYsmpMatrix<std::complex<double>_>_>::~TPZAutoPointer
          (TPZAutoPointer<TPZFYsmpMatrix<std::complex<double>_>_> *this)

{
  bool bVar1;
  TPZAutoPointer<TPZFYsmpMatrix<std::complex<double>_>_> *in_RDI;
  TPZReference *in_stack_00000018;
  
  if ((in_RDI->fRef != (TPZReference *)0x0) &&
     (bVar1 = TPZReference::Decrease(in_stack_00000018), bVar1)) {
    Release(in_RDI);
  }
  return;
}

Assistant:

~TPZAutoPointer()
	{        
        if (fRef && fRef->Decrease()){
            Release();
        }
	}